

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O1

void absl::lts_20240722::container_internal::
     raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
     ::resize_impl(CommonFields *common,ulong new_capacity)

{
  undefined4 *puVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  ctrl_t *pcVar5;
  undefined1 auVar6 [16];
  undefined8 uVar7;
  bool bVar8;
  ulong uVar9;
  undefined8 *puVar10;
  size_t sVar11;
  ctrl_t cVar12;
  ulong uVar13;
  FindInfo FVar14;
  HashSetResizeHelper resize_helper;
  undefined1 local_52;
  undefined1 local_51;
  HeapOrSoo local_50;
  size_t local_40;
  byte local_38;
  undefined2 local_37;
  
  if ((new_capacity != 0) && ((new_capacity + 1 & new_capacity) == 0)) {
    local_40 = common->capacity_;
    local_38 = (byte)common->size_ & 1;
    local_37 = 0;
    local_50._0_4_ = *(undefined4 *)&common->heap_or_soo_;
    local_50._4_4_ = *(undefined4 *)((long)&common->heap_or_soo_ + 4);
    local_50._8_4_ = *(undefined4 *)((long)&common->heap_or_soo_ + 8);
    local_50._12_4_ = *(undefined4 *)((long)&common->heap_or_soo_ + 0xc);
    common->capacity_ = new_capacity;
    bVar8 = HashSetResizeHelper::InitializeSlots<std::allocator<char>,40ul,false,false,8ul>
                      ((HashSetResizeHelper *)&local_50,common,&local_51,0xffffff80,4,0x28);
    if (local_40 != 0) {
      if (bVar8) {
        HashSetResizeHelper::
        GrowSizeIntoSingleGroup<absl::lts_20240722::container_internal::hash_policy_traits<absl::lts_20240722::container_internal::FlatHashMapPolicy<int,std::__cxx11::string>,void>,std::allocator<std::pair<int_const,std::__cxx11::string>>>
                  ((HashSetResizeHelper *)&local_50.heap,common,
                   (allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)common);
      }
      else {
        if ((char)local_37 == '\x01') {
          __assert_fail("!was_soo_",
                        "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                        ,0x7c2,
                        "void *absl::container_internal::HashSetResizeHelper::old_slots() const");
        }
        if (local_40 != 0) {
          lVar3 = *(long *)((long)&common->heap_or_soo_ + 8);
          puVar10 = (undefined8 *)(CONCAT44(local_50._12_4_,local_50._8_4_) + 0x18);
          sVar11 = 0;
          do {
            if ((char)local_37 == '\x01') {
              __assert_fail("!was_soo_",
                            "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                            ,0x7be,
                            "ctrl_t *absl::container_internal::HashSetResizeHelper::old_ctrl() const"
                           );
            }
            if (-1 < *(char *)(CONCAT44(local_50._4_4_,local_50._0_4_) + sVar11)) {
              auVar6._8_8_ = 0;
              auVar6._0_8_ = (long)&hash_internal::MixingHashState::kSeed +
                             (ulong)*(uint *)(puVar10 + -3);
              uVar13 = SUB168(auVar6 * ZEXT816(0x9ddfea08eb382d69),8) ^
                       SUB168(auVar6 * ZEXT816(0x9ddfea08eb382d69),0);
              FVar14 = absl::lts_20240722::container_internal::find_first_non_full<void>
                                 (common,uVar13);
              uVar9 = FVar14.offset;
              uVar4 = common->capacity_;
              if (uVar4 <= uVar9) {
                __assert_fail("i < c.capacity()",
                              "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                              ,0x70c,
                              "void absl::container_internal::DoSanitizeOnSetCtrl(const CommonFields &, size_t, ctrl_t, size_t)"
                             );
              }
              cVar12 = (ctrl_t)uVar13 & ~kEmpty;
              pcVar5 = (common->heap_or_soo_).heap.control;
              pcVar5[uVar9] = cVar12;
              pcVar5[(ulong)((uint)uVar4 & 0xf) + (uVar9 - 0xf & uVar4)] = cVar12;
              puVar1 = (undefined4 *)(lVar3 + uVar9 * 0x28);
              *puVar1 = *(undefined4 *)(puVar10 + -3);
              lVar2 = lVar3 + uVar9 * 0x28;
              *(undefined8 **)(lVar2 + 8) = (undefined8 *)(lVar2 + 0x18);
              if (puVar10 == (undefined8 *)puVar10[-2]) {
                uVar7 = puVar10[1];
                *(undefined8 *)(lVar2 + 0x18) = *puVar10;
                *(undefined8 *)(lVar2 + 0x20) = uVar7;
              }
              else {
                *(undefined8 **)(puVar1 + 2) = (undefined8 *)puVar10[-2];
                *(undefined8 *)(puVar1 + 6) = *puVar10;
              }
              *(undefined8 *)(puVar1 + 4) = puVar10[-1];
              puVar10[-2] = puVar10;
              puVar10[-1] = 0;
              *(undefined1 *)puVar10 = 0;
            }
            sVar11 = sVar11 + 1;
            puVar10 = puVar10 + 5;
          } while (sVar11 != local_40);
        }
        if ((common->size_ & 1) != 0) {
          CommonFields::backing_array_start(common);
        }
      }
      HashSetResizeHelper::DeallocateOld<8ul,std::allocator<char>>
                ((HashSetResizeHelper *)&local_50,&local_52,0x28);
    }
    return;
  }
  __assert_fail("IsValidCapacity(new_capacity)",
                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                ,0xe14,
                "static void absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<int, std::basic_string<char>>, absl::hash_internal::Hash<int>, std::equal_to<int>, std::allocator<std::pair<const int, std::basic_string<char>>>>::resize_impl(CommonFields &, size_t, HashtablezInfoHandle) [Policy = absl::container_internal::FlatHashMapPolicy<int, std::basic_string<char>>, Hash = absl::hash_internal::Hash<int>, Eq = std::equal_to<int>, Alloc = std::allocator<std::pair<const int, std::basic_string<char>>>]"
               );
}

Assistant:

inline bool IsValidCapacity(size_t n) { return ((n + 1) & n) == 0 && n > 0; }